

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitTupleExtract(BinaryInstWriter *this,TupleExtract *curr)

{
  Type *k;
  U32LEB x;
  size_t sVar1;
  iterator iVar2;
  uint *puVar3;
  BufferWithRandomAccess *pBVar4;
  size_t i;
  ulong uVar5;
  
  sVar1 = wasm::Type::size(&curr->tuple->type);
  for (uVar5 = (ulong)(curr->index + 1); uVar5 < sVar1; uVar5 = uVar5 + 1) {
    BufferWithRandomAccess::operator<<(this->o,'\x1a');
  }
  if (curr->index != 0) {
    k = &(curr->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type;
    iVar2 = InsertOrderedMap<wasm::Type,_unsigned_int>::find(&this->scratchLocals,k);
    if (iVar2._M_node != (_List_node_base *)&(this->scratchLocals).List) {
      puVar3 = InsertOrderedMap<wasm::Type,_unsigned_int>::operator[](&this->scratchLocals,k);
      x.value = *puVar3;
      pBVar4 = BufferWithRandomAccess::operator<<(this->o,'!');
      BufferWithRandomAccess::operator<<(pBVar4,x);
      for (uVar5 = 0; uVar5 < curr->index; uVar5 = uVar5 + 1) {
        BufferWithRandomAccess::operator<<(this->o,'\x1a');
      }
      pBVar4 = BufferWithRandomAccess::operator<<(this->o,' ');
      BufferWithRandomAccess::operator<<(pBVar4,x);
      return;
    }
    __assert_fail("scratchLocals.find(curr->type) != scratchLocals.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-stack.cpp"
                  ,0x7bf,"void wasm::BinaryInstWriter::visitTupleExtract(TupleExtract *)");
  }
  return;
}

Assistant:

void BinaryInstWriter::visitTupleExtract(TupleExtract* curr) {
  size_t numVals = curr->tuple->type.size();
  // Drop all values after the one we want
  for (size_t i = curr->index + 1; i < numVals; ++i) {
    o << int8_t(BinaryConsts::Drop);
  }
  // If the extracted value is the only one left, we're done
  if (curr->index == 0) {
    return;
  }
  // Otherwise, save it to a scratch local, drop the others, then retrieve it
  assert(scratchLocals.find(curr->type) != scratchLocals.end());
  auto scratch = scratchLocals[curr->type];
  o << int8_t(BinaryConsts::LocalSet) << U32LEB(scratch);
  for (size_t i = 0; i < curr->index; ++i) {
    o << int8_t(BinaryConsts::Drop);
  }
  o << int8_t(BinaryConsts::LocalGet) << U32LEB(scratch);
}